

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void bcemit_arith(FuncState *fs,BinOpr opr,ExpDesc *e1,ExpDesc *e2)

{
  int iVar1;
  BCReg BVar2;
  BCPos BVar3;
  uint local_38;
  uint32_t op;
  BCReg t;
  BCReg rc;
  BCReg rb;
  ExpDesc *e2_local;
  ExpDesc *e1_local;
  BinOpr opr_local;
  FuncState *fs_local;
  
  iVar1 = foldarith(opr,e1,e2);
  if (iVar1 == 0) {
    if (opr == OPR_POW) {
      local_38 = 0x25;
      op = expr_toanyreg(fs,e2);
      t = expr_toanyreg(fs,e1);
    }
    else {
      local_38 = opr + 0x20;
      expr_toval(fs,e2);
      if ((e2->k == VKLAST) && (op = const_num(fs,e2), op < 0x100)) {
        local_38 = opr + 0x16;
      }
      else {
        op = expr_toanyreg(fs,e2);
      }
      expr_toval(fs,e1);
      if (((e1->k == VKLAST) && (e2->k != VKLAST)) && (BVar2 = const_num(fs,e1), BVar2 < 0x100)) {
        t = op;
        local_38 = local_38 - 5;
        op = BVar2;
      }
      else {
        t = expr_toanyreg(fs,e1);
      }
    }
    if ((e1->k == VNONRELOC) && (fs->nactvar <= (e1->u).s.info)) {
      fs->freereg = fs->freereg - 1;
    }
    if ((e2->k == VNONRELOC) && (fs->nactvar <= (e2->u).s.info)) {
      fs->freereg = fs->freereg - 1;
    }
    BVar3 = bcemit_INS(fs,local_38 | t << 0x18 | op << 0x10);
    (e1->u).s.info = BVar3;
    e1->k = VRELOCABLE;
  }
  return;
}

Assistant:

static void bcemit_arith(FuncState *fs, BinOpr opr, ExpDesc *e1, ExpDesc *e2)
{
  BCReg rb, rc, t;
  uint32_t op;
  if (foldarith(opr, e1, e2))
    return;
  if (opr == OPR_POW) {
    op = BC_POW;
    rc = expr_toanyreg(fs, e2);
    rb = expr_toanyreg(fs, e1);
  } else {
    op = opr-OPR_ADD+BC_ADDVV;
    /* Must discharge 2nd operand first since VINDEXED might free regs. */
    expr_toval(fs, e2);
    if (expr_isnumk(e2) && (rc = const_num(fs, e2)) <= BCMAX_C)
      op -= BC_ADDVV-BC_ADDVN;
    else
      rc = expr_toanyreg(fs, e2);
    /* 1st operand discharged by bcemit_binop_left, but need KNUM/KSHORT. */
    lj_assertFS(expr_isnumk(e1) || e1->k == VNONRELOC,
		"bad expr type %d", e1->k);
    expr_toval(fs, e1);
    /* Avoid two consts to satisfy bytecode constraints. */
    if (expr_isnumk(e1) && !expr_isnumk(e2) &&
	(t = const_num(fs, e1)) <= BCMAX_B) {
      rb = rc; rc = t; op -= BC_ADDVV-BC_ADDNV;
    } else {
      rb = expr_toanyreg(fs, e1);
    }
  }
  /* Using expr_free might cause asserts if the order is wrong. */
  if (e1->k == VNONRELOC && e1->u.s.info >= fs->nactvar) fs->freereg--;
  if (e2->k == VNONRELOC && e2->u.s.info >= fs->nactvar) fs->freereg--;
  e1->u.s.info = bcemit_ABC(fs, op, 0, rb, rc);
  e1->k = VRELOCABLE;
}